

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O3

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::pipeline::anon_unknown_1::createSubresourceRangeTests
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,VkImageViewType viewType,
          VkFormat imageFormat)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  bool bVar11;
  deUint32 dVar12;
  uint uVar13;
  TestNode *pTVar14;
  ostream *poVar15;
  ImageViewTest *pIVar16;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *pMVar17;
  TestCaseConfig *pTVar18;
  bool bVar19;
  long lVar20;
  long *local_3c8;
  long local_3b8 [2];
  TestCaseConfig config;
  TestCaseConfig arrayRangeCases [3];
  TestCaseConfig mipLevelAndArrayRangeCases [4];
  TestCaseConfig config_16;
  TestCaseConfig local_228;
  char *local_208;
  undefined4 local_200;
  undefined8 local_1fc;
  undefined8 uStack_1f4;
  undefined4 local_1ec;
  TestCaseConfig arrayRangeCases_2 [2];
  ostringstream desc;
  ios_base local_138 [264];
  
  uVar13 = ImageViewTest::getNumLevels(viewType);
  arrayRangeCases[0].subresourceRange.layerCount = 6;
  if (viewType - VK_IMAGE_VIEW_TYPE_3D < 5) {
    arrayRangeCases[0].subresourceRange.layerCount =
         *(deUint32 *)(&DAT_00ab55a8 + (ulong)(viewType - VK_IMAGE_VIEW_TYPE_3D) * 4);
  }
  pTVar14 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar14,testCtx,"subresource_range","");
  (__return_storage_ptr__->
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).m_data.ptr =
       (TestCaseGroup *)pTVar14;
  pMVar17 = (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
            (ulong)(viewType & ~VK_IMAGE_VIEW_TYPE_2D);
  arrayRangeCases[1].subresourceRange.levelCount = uVar13;
  local_228.subresourceRange.levelCount = uVar13;
  arrayRangeCases_2[1].subresourceRange.layerCount = arrayRangeCases[0].subresourceRange.layerCount;
  if ((viewType & ~VK_IMAGE_VIEW_TYPE_2D) == VK_IMAGE_VIEW_TYPE_1D_ARRAY) {
    arrayRangeCases_2[0].name = "lod_base_mip_level";
    arrayRangeCases_2[0].samplerLod = 0.0;
    arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = uVar13 - 2;
    arrayRangeCases_2[0].subresourceRange._12_8_ =
         (ulong)arrayRangeCases[0].subresourceRange.layerCount << 0x20;
    arrayRangeCases_2[1].name = "lod_mip_levels";
    arrayRangeCases_2[1].samplerLod = 4.0;
    arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases_2[1].subresourceRange.levelCount = 3;
    arrayRangeCases_2[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].name = "base_array_layer";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
    arrayRangeCases[0].subresourceRange.levelCount = uVar13;
    arrayRangeCases[1].name = "array_size";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[1].subresourceRange.layerCount = 4;
    arrayRangeCases[2].name = "array_base_and_size";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange._4_8_ = (ulong)uVar13 << 0x20;
    arrayRangeCases[2].subresourceRange.baseArrayLayer = 2;
    arrayRangeCases[2].subresourceRange.layerCount = 3;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_base_array_layer";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 5;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_base_array_layer";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 5;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_size";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 4;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_size";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 4;
    config_16.name = "lod_base_mip_level_remaining_levels";
    config_16.samplerLod = 0.0;
    config_16.subresourceRange.aspectMask = 1;
    config_16.subresourceRange.baseMipLevel = 1;
    config_16.subresourceRange.levelCount = 0xffffffff;
    config_16.subresourceRange.baseArrayLayer = 0;
    local_228.name = "base_array_layer_remaining_layers";
    local_228.samplerLod = 0.0;
    local_228.subresourceRange.aspectMask = 1;
    local_228.subresourceRange.baseMipLevel = 0;
    local_228.subresourceRange.baseArrayLayer = 1;
    local_228.subresourceRange.layerCount = 0xffffffff;
    local_208 = "lod_base_mip_level_base_array_layer_remaining_levels_and_layers";
    local_200 = 0;
    local_1fc = 0x200000001;
    uStack_1f4 = 0x2ffffffff;
    local_1ec = 0xffffffff;
    pTVar18 = arrayRangeCases_2;
    bVar11 = true;
    dVar12 = arrayRangeCases[0].subresourceRange.layerCount - 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    config_16.subresourceRange.layerCount = arrayRangeCases[0].subresourceRange.layerCount;
    arrayRangeCases_2[0].subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    do {
      arrayRangeCases[0].subresourceRange.layerCount = dVar12;
      bVar19 = bVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = pTVar18->name;
      config.samplerLod = pTVar18->samplerLod;
      config.subresourceRange.aspectMask = (pTVar18->subresourceRange).aspectMask;
      config.subresourceRange.baseMipLevel = (pTVar18->subresourceRange).baseMipLevel;
      config.subresourceRange.levelCount = (pTVar18->subresourceRange).levelCount;
      config.subresourceRange.baseArrayLayer = (pTVar18->subresourceRange).baseArrayLayer;
      config.subresourceRange.layerCount = (pTVar18->subresourceRange).layerCount;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pTVar14 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      pTVar18 = arrayRangeCases_2 + 1;
      bVar11 = false;
      dVar12 = arrayRangeCases[0].subresourceRange.layerCount;
    } while (bVar19);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x60);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0xc0);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&config_16.name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&config_16.samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&config_16.subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&config_16.subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      pMVar17 = (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x60);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
    arrayRangeCases_2[0].name = "lod_base_mip_level";
    arrayRangeCases_2[0].samplerLod = 0.0;
    arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = uVar13 - 2;
    arrayRangeCases_2[0].subresourceRange._12_8_ =
         (ulong)arrayRangeCases[0].subresourceRange.layerCount << 0x20;
    arrayRangeCases_2[1].name = "lod_mip_levels";
    arrayRangeCases_2[1].samplerLod = 4.0;
    arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases_2[1].subresourceRange.levelCount = 3;
    arrayRangeCases_2[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].name = "base_array_layer";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
    arrayRangeCases[0].subresourceRange.levelCount = uVar13;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount =
         arrayRangeCases[0].subresourceRange.layerCount - 6;
    arrayRangeCases[1].name = "array_size";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[1].subresourceRange.layerCount = 6;
    arrayRangeCases[2].name = "array_base_and_size";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange._4_8_ = (ulong)uVar13 << 0x20;
    arrayRangeCases[2].subresourceRange.baseArrayLayer = 0xc;
    arrayRangeCases[2].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_base_array_layer";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_base_array_layer";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_size";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_size";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 6;
    config_16.name = "lod_base_mip_level_remaining_levels";
    config_16.samplerLod = 0.0;
    config_16.subresourceRange.aspectMask = 1;
    config_16.subresourceRange.baseMipLevel = 1;
    config_16.subresourceRange.levelCount = 0xffffffff;
    config_16.subresourceRange.baseArrayLayer = 0;
    local_228.name = "base_array_layer_remaining_layers";
    local_228.samplerLod = 0.0;
    local_228.subresourceRange.aspectMask = 1;
    local_228.subresourceRange.baseMipLevel = 0;
    local_228.subresourceRange.baseArrayLayer = 6;
    local_228.subresourceRange.layerCount = 0xffffffff;
    local_208 = "lod_base_mip_level_base_array_layer_remaining_levels_and_layers";
    local_200 = 0;
    local_1fc = 0x200000001;
    uStack_1f4 = 0xcffffffff;
    local_1ec = 0xffffffff;
    pTVar18 = arrayRangeCases_2;
    bVar11 = true;
    dVar12 = mipLevelAndArrayRangeCases[0].subresourceRange.layerCount;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.layerCount;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    config_16.subresourceRange.layerCount = arrayRangeCases[0].subresourceRange.layerCount;
    arrayRangeCases_2[0].subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    do {
      arrayRangeCases[0].subresourceRange.layerCount = dVar12;
      bVar19 = bVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = pTVar18->name;
      config.samplerLod = pTVar18->samplerLod;
      config.subresourceRange.aspectMask = (pTVar18->subresourceRange).aspectMask;
      config.subresourceRange.baseMipLevel = (pTVar18->subresourceRange).baseMipLevel;
      config.subresourceRange.levelCount = (pTVar18->subresourceRange).levelCount;
      config.subresourceRange.baseArrayLayer = (pTVar18->subresourceRange).baseArrayLayer;
      config.subresourceRange.layerCount = (pTVar18->subresourceRange).layerCount;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pTVar14 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat
                 ,config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      pTVar18 = arrayRangeCases_2 + 1;
      bVar11 = false;
      dVar12 = arrayRangeCases[0].subresourceRange.layerCount;
    } while (bVar19);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat
                 ,config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x60);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat
                 ,config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0xc0);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&config_16.name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&config_16.samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&config_16.subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&config_16.subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat
                 ,config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      pMVar17 = (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x60);
  }
  else if (viewType < VK_IMAGE_VIEW_TYPE_3D) {
    config_16.name = "lod_base_mip_level";
    config_16.samplerLod = 0.0;
    config_16.subresourceRange.aspectMask = 1;
    config_16.subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = uVar13 - 2;
    config_16.subresourceRange.baseArrayLayer = 0;
    config_16.subresourceRange.layerCount = 1;
    local_228.name = "lod_mip_levels";
    local_228.samplerLod = 4.0;
    local_228.subresourceRange.aspectMask = 1;
    local_228.subresourceRange.baseMipLevel = 0;
    local_228.subresourceRange.levelCount = 3;
    local_228.subresourceRange.baseArrayLayer = 0;
    local_228.subresourceRange.layerCount = 1;
    arrayRangeCases_2[0].name = "array_layer_second";
    arrayRangeCases_2[0].samplerLod = 0.0;
    arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[0].subresourceRange.baseMipLevel = 0;
    arrayRangeCases_2[0].subresourceRange.baseArrayLayer = 1;
    arrayRangeCases_2[0].subresourceRange.layerCount = 1;
    arrayRangeCases_2[1].name = "array_layer_last";
    arrayRangeCases_2[1].samplerLod = 0.0;
    arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.baseArrayLayer =
         arrayRangeCases[0].subresourceRange.layerCount - 1;
    arrayRangeCases_2[1].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    arrayRangeCases_2[1].subresourceRange.levelCount = uVar13;
    arrayRangeCases_2[1].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_array_layer_second";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_array_layer_second";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_layer_last";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 5;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 1;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_layer_last";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 1;
    arrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    arrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].subresourceRange.layerCount = 1;
    arrayRangeCases[1].name = "array_layer_last_remaining_layers";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[2].name = "lod_base_mip_level_array_layer_last_remaining_levels_and_layers";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    arrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    pTVar18 = &config_16;
    bVar11 = true;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    config_16.subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    arrayRangeCases_2[0].subresourceRange.levelCount = uVar13;
    do {
      bVar19 = bVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = pTVar18->name;
      config.samplerLod = pTVar18->samplerLod;
      config.subresourceRange.aspectMask = (pTVar18->subresourceRange).aspectMask;
      config.subresourceRange.baseMipLevel = (pTVar18->subresourceRange).baseMipLevel;
      config.subresourceRange.levelCount = (pTVar18->subresourceRange).levelCount;
      config.subresourceRange.baseArrayLayer = (pTVar18->subresourceRange).baseArrayLayer;
      config.subresourceRange.layerCount = (pTVar18->subresourceRange).layerCount;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pTVar14 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      pTVar18 = &local_228;
      bVar11 = false;
    } while (bVar19);
    pTVar18 = arrayRangeCases_2;
    bVar11 = true;
    do {
      bVar19 = bVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = pTVar18->name;
      config.samplerLod = pTVar18->samplerLod;
      config.subresourceRange.aspectMask = (pTVar18->subresourceRange).aspectMask;
      config.subresourceRange.baseMipLevel = (pTVar18->subresourceRange).baseMipLevel;
      config.subresourceRange.levelCount = (pTVar18->subresourceRange).levelCount;
      config.subresourceRange.baseArrayLayer = (pTVar18->subresourceRange).baseArrayLayer;
      config.subresourceRange.layerCount = (pTVar18->subresourceRange).layerCount;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      pTVar18 = arrayRangeCases_2 + 1;
      bVar11 = false;
    } while (bVar19);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x80);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,viewType,imageFormat,config.samplerLod,
                 (VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      pMVar17 = (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x60);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_3D) {
    arrayRangeCases[0].name = "lod_base_mip_level";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].subresourceRange.levelCount = uVar13 - 2;
    arrayRangeCases[1].name = "lod_mip_levels";
    arrayRangeCases[1].samplerLod = 4.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.levelCount = 3;
    arrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[1].name = "single_array_layer_remaining_layers";
    mipLevelAndArrayRangeCases[1].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    mipLevelAndArrayRangeCases[2].name =
         "lod_base_mip_level_single_array_layer_remaining_levels_and_layers";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer = 0;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    pTVar18 = arrayRangeCases;
    bVar11 = true;
    arrayRangeCases[1].subresourceRange.layerCount = arrayRangeCases[0].subresourceRange.layerCount;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount =
         arrayRangeCases[0].subresourceRange.layerCount;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = uVar13;
    do {
      bVar19 = bVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config_16.name = pTVar18->name;
      uVar1 = pTVar18->samplerLod;
      uVar2 = (pTVar18->subresourceRange).aspectMask;
      uVar3 = (pTVar18->subresourceRange).baseMipLevel;
      uVar4 = (pTVar18->subresourceRange).levelCount;
      uVar5 = (pTVar18->subresourceRange).baseArrayLayer;
      uVar6 = (pTVar18->subresourceRange).layerCount;
      config_16.samplerLod = (float)uVar1;
      config_16.subresourceRange.aspectMask = uVar2;
      config_16.subresourceRange.baseMipLevel = uVar3;
      config_16.subresourceRange.levelCount = uVar4;
      config_16.subresourceRange.baseArrayLayer = uVar5;
      config_16.subresourceRange.layerCount = uVar6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config_16.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config_16.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config_16.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,arrayRangeCases_2[0].name,VK_IMAGE_VIEW_TYPE_3D,imageFormat
                 ,config_16.samplerLod,(VkComponentMapping *)&DAT_00aa2050,
                 &config_16.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if ((deUint32 *)arrayRangeCases_2[0].name !=
          &arrayRangeCases_2[0].subresourceRange.baseMipLevel) {
        operator_delete(arrayRangeCases_2[0].name,
                        CONCAT44(arrayRangeCases_2[0].subresourceRange.levelCount,
                                 arrayRangeCases_2[0].subresourceRange.baseMipLevel) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      pTVar18 = arrayRangeCases + 1;
      bVar11 = false;
    } while (bVar19);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config_16.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar20);
      uVar7 = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar20);
      uVar8 = *(undefined8 *)
               ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      uVar9 = *(undefined8 *)
               ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      config_16.subresourceRange.baseMipLevel = (deUint32)uVar8;
      config_16.subresourceRange.levelCount = (deUint32)((ulong)uVar8 >> 0x20);
      config_16.subresourceRange.baseArrayLayer = (deUint32)uVar9;
      config_16.subresourceRange.layerCount = (deUint32)((ulong)uVar9 >> 0x20);
      config_16.samplerLod = (float)uVar7;
      config_16.subresourceRange.aspectMask = (VkImageAspectFlags)((ulong)uVar7 >> 0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config_16.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config_16.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config_16.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,arrayRangeCases_2[0].name,VK_IMAGE_VIEW_TYPE_3D,imageFormat
                 ,config_16.samplerLod,(VkComponentMapping *)&DAT_00aa2050,
                 &config_16.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if ((deUint32 *)arrayRangeCases_2[0].name !=
          &arrayRangeCases_2[0].subresourceRange.baseMipLevel) {
        operator_delete(arrayRangeCases_2[0].name,
                        CONCAT44(arrayRangeCases_2[0].subresourceRange.levelCount,
                                 arrayRangeCases_2[0].subresourceRange.baseMipLevel) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      pMVar17 = (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x60);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE) {
    config_16.name = "lod_base_mip_level";
    config_16.samplerLod = 0.0;
    config_16.subresourceRange.aspectMask = 1;
    config_16.subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = uVar13 - 2;
    config_16.subresourceRange.baseArrayLayer = 0;
    config_16.subresourceRange.layerCount = 6;
    local_228.name = "lod_mip_levels";
    local_228.samplerLod = 4.0;
    local_228.subresourceRange.aspectMask = 1;
    local_228.subresourceRange.baseMipLevel = 0;
    local_228.subresourceRange.levelCount = 3;
    local_228.subresourceRange.baseArrayLayer = 0;
    local_228.subresourceRange.layerCount = 6;
    arrayRangeCases_2[0].name = "array_layer_second";
    arrayRangeCases_2[0].samplerLod = 0.0;
    arrayRangeCases_2[0].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[0].subresourceRange.baseMipLevel = 0;
    arrayRangeCases_2[0].subresourceRange.baseArrayLayer = 6;
    arrayRangeCases_2[0].subresourceRange.layerCount = 6;
    arrayRangeCases_2[1].name = "array_layer_last";
    arrayRangeCases_2[1].samplerLod = 0.0;
    arrayRangeCases_2[1].subresourceRange.aspectMask = 1;
    arrayRangeCases_2[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.baseArrayLayer =
         arrayRangeCases[0].subresourceRange.layerCount - 6;
    arrayRangeCases_2[1].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    arrayRangeCases_2[1].subresourceRange.levelCount = uVar13;
    arrayRangeCases_2[1].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[0].name = "lod_base_mip_level_array_layer_second";
    mipLevelAndArrayRangeCases[0].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[0].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[1].name = "lod_mip_levels_array_layer_second";
    mipLevelAndArrayRangeCases[1].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseArrayLayer = 6;
    mipLevelAndArrayRangeCases[1].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[2].name = "lod_base_mip_level_array_layer_last";
    mipLevelAndArrayRangeCases[2].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.layerCount = 6;
    mipLevelAndArrayRangeCases[3].name = "lod_mip_levels_array_layer_last";
    mipLevelAndArrayRangeCases[3].samplerLod = 4.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 1;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.layerCount = 6;
    arrayRangeCases[0].name = "lod_base_mip_level_remaining_levels";
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.aspectMask = 1;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    arrayRangeCases[0].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[0].subresourceRange.baseArrayLayer = 0;
    arrayRangeCases[0].subresourceRange.layerCount = 6;
    arrayRangeCases[1].name = "array_layer_last_remaining_layers";
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.aspectMask = 1;
    arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[2].name = "lod_base_mip_level_array_layer_last_remaining_levels_and_layers";
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.aspectMask = 1;
    arrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    arrayRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.layerCount = 0xffffffff;
    arrayRangeCases[2].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    pTVar18 = &config_16;
    bVar11 = true;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseArrayLayer =
         arrayRangeCases[1].subresourceRange.baseArrayLayer;
    config_16.subresourceRange.levelCount =
         mipLevelAndArrayRangeCases[0].subresourceRange.levelCount;
    arrayRangeCases_2[0].subresourceRange.levelCount = uVar13;
    do {
      bVar19 = bVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = pTVar18->name;
      config.samplerLod = pTVar18->samplerLod;
      config.subresourceRange.aspectMask = (pTVar18->subresourceRange).aspectMask;
      config.subresourceRange.baseMipLevel = (pTVar18->subresourceRange).baseMipLevel;
      config.subresourceRange.levelCount = (pTVar18->subresourceRange).levelCount;
      config.subresourceRange.baseArrayLayer = (pTVar18->subresourceRange).baseArrayLayer;
      config.subresourceRange.layerCount = (pTVar18->subresourceRange).layerCount;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pTVar14 = &((__return_storage_ptr__->
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>).
                  m_data.ptr)->super_TestNode;
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      pTVar18 = &local_228;
      bVar11 = false;
    } while (bVar19);
    pTVar18 = arrayRangeCases_2;
    bVar11 = true;
    do {
      bVar19 = bVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = pTVar18->name;
      config.samplerLod = pTVar18->samplerLod;
      config.subresourceRange.aspectMask = (pTVar18->subresourceRange).aspectMask;
      config.subresourceRange.baseMipLevel = (pTVar18->subresourceRange).baseMipLevel;
      config.subresourceRange.levelCount = (pTVar18->subresourceRange).levelCount;
      config.subresourceRange.baseArrayLayer = (pTVar18->subresourceRange).baseArrayLayer;
      config.subresourceRange.layerCount = (pTVar18->subresourceRange).layerCount;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      pTVar18 = arrayRangeCases_2 + 1;
      bVar11 = false;
    } while (bVar19);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&mipLevelAndArrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&mipLevelAndArrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)
            ((long)&mipLevelAndArrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x80);
    lVar20 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&desc);
      config.name = *(char **)((long)&arrayRangeCases[0].name + lVar20);
      config._8_8_ = *(undefined8 *)((long)&arrayRangeCases[0].samplerLod + lVar20);
      config.subresourceRange._4_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseMipLevel + lVar20);
      config.subresourceRange._12_8_ =
           *(undefined8 *)((long)&arrayRangeCases[0].subresourceRange.baseArrayLayer + lVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&desc,"Samples level ",0xe);
      poVar15 = std::ostream::_M_insert<double>((double)config.samplerLod);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," with :\n",8);
      ::vk::operator<<(poVar15,&config.subresourceRange);
      pIVar16 = (ImageViewTest *)operator_new(0xa0);
      pcVar10 = config.name;
      std::__cxx11::stringbuf::str();
      ImageViewTest::ImageViewTest
                (pIVar16,testCtx,pcVar10,(char *)local_3c8,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                 config.samplerLod,(VkComponentMapping *)&DAT_00aa2050,&config.subresourceRange);
      tcu::TestNode::addChild(pTVar14,(TestNode *)pIVar16);
      if (local_3c8 != local_3b8) {
        operator_delete(local_3c8,local_3b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&desc);
      pMVar17 = (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                std::ios_base::~ios_base(local_138);
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0x60);
  }
  return pMVar17;
}

Assistant:

static de::MovePtr<tcu::TestCaseGroup> createSubresourceRangeTests(tcu::TestContext& testCtx, VkImageViewType viewType, VkFormat imageFormat)
{
	struct TestCaseConfig
	{
		const char*				name;
		float					samplerLod;
		VkImageSubresourceRange	subresourceRange;
	};

	const deUint32				numLevels				= ImageViewTest::getNumLevels(viewType);
	const deUint32				arraySize				= ImageViewTest::getArraySize(viewType);
	const VkImageAspectFlags	imageAspectFlags		= VK_IMAGE_ASPECT_COLOR_BIT;
	const VkComponentMapping	componentMapping		= { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A };

	de::MovePtr<tcu::TestCaseGroup> rangeTests (new tcu::TestCaseGroup(testCtx, "subresource_range", ""));

#define ADD_SUBRESOURCE_RANGE_TESTS(TEST_CASES)															\
	do {																								\
		for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(TEST_CASES); configNdx++)				\
		{																								\
			std::ostringstream		desc;																\
			const TestCaseConfig	config	= (TEST_CASES)[configNdx];									\
			desc << "Samples level " << config.samplerLod << " with :\n" << config.subresourceRange;	\
			rangeTests->addChild(new ImageViewTest(testCtx, config.name, desc.str().c_str(), viewType,	\
												   imageFormat, config.samplerLod, componentMapping,	\
												   config.subresourceRange));							\
		}																								\
	} while (deGetFalse())

	if (viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY || viewType == VK_IMAGE_VIEW_TYPE_2D_ARRAY)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "base_array_layer",		0.0f,			{ imageAspectFlags, 0u, numLevels, 1u, arraySize - 1u } },
			{ "array_size",				0.0f,			{ imageAspectFlags, 0u, numLevels, 0u, 4u } },
			{ "array_base_and_size",	0.0f,			{ imageAspectFlags, 0u, numLevels, 2u, 3u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name										samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_base_array_layer",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 1u, 5u } },
			{ "lod_mip_levels_base_array_layer",			4.0f,			{ imageAspectFlags, 0u, 3u, 1u, 5u } },

			{ "lod_base_mip_level_array_size",				0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 0u, 4u } },
			{ "lod_mip_levels_array_size",					4.0f,			{ imageAspectFlags, 0u, 3u, 0u, 4u } },

			{ "lod_base_mip_level_array_base_and_size",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 2u, 3u } },
			{ "lod_mip_levels_array_base_and_size",			4.0f,			{ imageAspectFlags, 0u, 3u, 2u, 3u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,	arraySize					} },
			{ "base_array_layer_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					1u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_base_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	2u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "base_array_layer",		0.0f,			{ imageAspectFlags, 0u, numLevels, 6u, arraySize - 6u } },
			{ "array_size",				0.0f,			{ imageAspectFlags, 0u, numLevels, 0u, 6u } },
			{ "array_base_and_size",	0.0f,			{ imageAspectFlags, 0u, numLevels, 12u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name										samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_base_array_layer",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 6u, arraySize - 6u } },
			{ "lod_mip_levels_base_array_layer",			4.0f,			{ imageAspectFlags, 0u, 3u, 6u, arraySize - 6u } },

			{ "lod_base_mip_level_array_size",				0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 0u, 6u } },
			{ "lod_mip_levels_array_size",					4.0f,			{ imageAspectFlags, 0u, 3u, 0u, 6u } },

			{ "lod_base_mip_level_array_base_and_size",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 12u, 6u } },
			{ "lod_mip_levels_array_base_and_size",			4.0f,			{ imageAspectFlags, 0u, 3u, 12u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,		arraySize					} },
			{ "base_array_layer_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					6u,		VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_base_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	12u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_1D || viewType == VK_IMAGE_VIEW_TYPE_2D)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, 1u } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, 1u } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "array_layer_second",		0.0f,			{ imageAspectFlags, 0u, numLevels, 1u, 1u } },
			{ "array_layer_last",		0.0f,			{ imageAspectFlags, 0u, numLevels, arraySize - 1u, 1u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name									samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_array_layer_second",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 1u, 1u } },
			{ "lod_mip_levels_array_layer_second",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 1u, 1u } },

			{ "lod_base_mip_level_array_layer_last",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 5u, 1u } },
			{ "lod_mip_levels_array_layer_last",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 1u, 1u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,				1u							} },
			{ "array_layer_last_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					arraySize - 1u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_array_layer_last_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	arraySize - 1u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, 6u } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, 6u } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "array_layer_second",		0.0f,			{ imageAspectFlags, 0u, numLevels, 6u, 6u } },
			{ "array_layer_last",		0.0f,			{ imageAspectFlags, 0u, numLevels, arraySize - 6u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name									samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_array_layer_second",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 6u, 6u } },
			{ "lod_mip_levels_array_layer_second",		4.0f,		{ imageAspectFlags, 0u, 3u, 6u, 6u } },

			{ "lod_base_mip_level_array_layer_last",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, arraySize - 6u, 6u } },
			{ "lod_mip_levels_array_layer_last",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 6u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,				6u							} },
			{ "array_layer_last_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					arraySize - 6u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_array_layer_last_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	arraySize - 6u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_3D)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,	arraySize					} },
			{ "single_array_layer_remaining_layers",								0.0f,		{ imageAspectFlags,	0u,	numLevels,					0u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_single_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	0u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}

#undef ADD_SUBRESOURCE_RANGE_TESTS

	return rangeTests;
}